

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

int __thiscall QList<QNetworkCookie>::remove(QList<QNetworkCookie> *this,char *__filename)

{
  QList<QNetworkCookie> *extraout_RAX;
  long in_RDX;
  qsizetype in_stack_00000010;
  QNetworkCookie *in_stack_00000018;
  QMovableArrayOps<QNetworkCookie> *in_stack_00000020;
  QArrayDataPointer<QNetworkCookie> *in_stack_ffffffffffffffd8;
  
  if (in_RDX != 0) {
    QArrayDataPointer<QNetworkCookie>::detach(&this->d,in_stack_ffffffffffffffd8);
    QArrayDataPointer<QNetworkCookie>::operator->(&this->d);
    QArrayDataPointer<QNetworkCookie>::operator->(&this->d);
    QArrayDataPointer<QNetworkCookie>::begin((QArrayDataPointer<QNetworkCookie> *)0x1bc6f9);
    QtPrivate::QMovableArrayOps<QNetworkCookie>::erase
              (in_stack_00000020,in_stack_00000018,in_stack_00000010);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

inline void QList<T>::remove(qsizetype i, qsizetype n)
{
    Q_ASSERT_X(size_t(i) + size_t(n) <= size_t(d->size), "QList::remove", "index out of range");
    Q_ASSERT_X(n >= 0, "QList::remove", "invalid count");

    if (n == 0)
        return;

    d.detach();
    d->erase(d->begin() + i, n);
}